

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

int64_t spvtools::opt::anon_unknown_15::GreatestCommonDivisor(int64_t a,int64_t b)

{
  ulong uVar1;
  int64_t iVar2;
  long lVar3;
  
  do {
    lVar3 = a % 2;
    uVar1 = b;
    do {
      b = uVar1;
      uVar1 = b;
      if (((a == b) || (a == 0)) || (uVar1 = a, b == 0)) {
        return uVar1;
      }
      if ((b & 1U) == 0 && lVar3 == 0) {
        iVar2 = GreatestCommonDivisor(a / 2,b >> 1);
        return iVar2 * 2;
      }
      if ((b & 0x8000000000000001U) == 1 && lVar3 == 0) goto LAB_00232052;
    } while ((lVar3 == 1) && (uVar1 = b >> 1, (b & 1U) == 0));
    uVar1 = a - b;
    if (a - b == 0 || a < b) {
      uVar1 = b - a;
      b = a;
    }
LAB_00232052:
    a = (long)uVar1 / 2;
  } while( true );
}

Assistant:

int64_t GreatestCommonDivisor(int64_t a, int64_t b) {
  // Simple cases
  if (a == b) {
    return a;
  } else if (a == 0) {
    return b;
  } else if (b == 0) {
    return a;
  }

  // Both even
  if (a % 2 == 0 && b % 2 == 0) {
    return 2 * GreatestCommonDivisor(a / 2, b / 2);
  }

  // Even a, odd b
  if (a % 2 == 0 && b % 2 == 1) {
    return GreatestCommonDivisor(a / 2, b);
  }

  // Odd a, even b
  if (a % 2 == 1 && b % 2 == 0) {
    return GreatestCommonDivisor(a, b / 2);
  }

  // Both odd, reduce the larger argument
  if (a > b) {
    return GreatestCommonDivisor((a - b) / 2, b);
  } else {
    return GreatestCommonDivisor((b - a) / 2, a);
  }
}